

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

char * cimg_library::cimg::ftype(FILE *file,char *filename)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  uint mode;
  long lVar4;
  int iVar5;
  CImgArgumentException *this;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  char local_69;
  CImg<char> header;
  CImgList<char> _header;
  CImg<char> local_38;
  
  mode = exception_mode::mode;
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (this,"cimg::ftype(): Specified filename is (null).");
    __cxa_throw(this,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  header._data = (char *)0x0;
  header._width = 0;
  header._height = 0;
  header._depth = 0;
  header._spectrum = 0;
  header._is_shared = false;
  exception_mode(0);
  CImg<char>::_load_raw(&header,file,filename,0x200,1,1,1,false,false,0);
  pcVar6 = header._data;
  iVar5 = strncmp(header._data,"OFF\n",4);
  if (iVar5 == 0) {
    pcVar8 = "off";
    goto LAB_0017e017;
  }
  iVar5 = strncmp(pcVar6,"#INRIMAGE",9);
  if (iVar5 == 0) {
    pcVar8 = "inr";
    goto LAB_0017e017;
  }
  iVar5 = strncmp(pcVar6,"PANDORE",7);
  if (iVar5 == 0) {
    pcVar8 = "pan";
    goto LAB_0017e017;
  }
  iVar5 = strncmp(pcVar6 + 0x80,"DICM",4);
  if (iVar5 == 0) {
    pcVar8 = "dcm";
    goto LAB_0017e017;
  }
  cVar1 = *pcVar6;
  if (cVar1 == 'B') {
    if (pcVar6[1] == 'M') {
      pcVar8 = "bmp";
      goto LAB_0017e017;
    }
  }
  else if (cVar1 == 'G') {
    if ((((pcVar6[1] == 'I') && (pcVar6[2] == 'F')) && (pcVar6[3] == '8')) && (pcVar6[5] == 'a')) {
      pcVar8 = "gif";
      if ((pcVar6[4] == '7') || (pcVar6[4] == '9')) goto LAB_0017e017;
    }
  }
  else if (cVar1 == 'I') {
    if (pcVar6[1] == 'I') {
LAB_0017df03:
      pcVar8 = "tif";
      goto LAB_0017e017;
    }
  }
  else if (cVar1 == 'M') {
    if (pcVar6[1] == 'M') goto LAB_0017df03;
  }
  else if (cVar1 == -0x77) {
    if ((((pcVar6[1] == 'P') && (pcVar6[2] == 'N')) &&
        ((pcVar6[3] == 'G' &&
         (((pcVar6[4] == '\r' && (pcVar6[5] == '\n')) && (pcVar6[6] == '\x1a')))))) &&
       (pcVar6[7] == '\n')) {
      pcVar8 = "png";
      goto LAB_0017e017;
    }
  }
  else if (((cVar1 == -1) && (pcVar6[1] == -0x28)) && (pcVar6[2] == -1)) {
    pcVar8 = "jpg";
    goto LAB_0017e017;
  }
  local_69 = '\n';
  CImg<char>::vector(&local_38,&local_69);
  pcVar8 = (char *)0x0;
  CImg<char>::get_split<char>((CImg<char> *)&_header,&header,(char)&local_38,false);
  CImg<char>::~CImg(&local_38);
  pcVar6 = (char *)(ulong)_header._width;
  if ((int)_header._width < 1) {
    pcVar6 = pcVar8;
  }
  lVar4 = 0;
  do {
    lVar7 = lVar4;
    if ((long)pcVar6 * 0x20 + 0x20 == lVar7 + 0x20) goto LAB_0017e00d;
    pcVar3 = *(char **)((long)&(_header._data)->_data + lVar7);
    cVar1 = *pcVar3;
    lVar4 = lVar7 + 0x20;
  } while (cVar1 == '#');
  if ((cVar1 == 'P') && (*(int *)((long)&(_header._data)->_height + lVar7) == 2)) {
    bVar2 = pcVar3[1];
    pcVar6 = (char *)0x0;
    bVar9 = 0xf6 < (byte)(bVar2 - 0x3a);
    if (bVar9) {
      pcVar6 = "pnm";
    }
    bVar10 = (bVar2 & 0xdf) != 0x46;
    pcVar8 = "pfm";
    if (bVar10) {
      pcVar8 = pcVar6;
    }
    if (bVar10 && !bVar9) goto LAB_0017e00a;
  }
  else {
LAB_0017e00a:
    pcVar8 = (char *)0x0;
  }
LAB_0017e00d:
  CImgList<char>::~CImgList(&_header);
LAB_0017e017:
  exception_mode(mode);
  CImg<char>::~CImg(&header);
  return pcVar8;
}

Assistant:

inline const char *ftype(std::FILE *const file, const char *const filename) {
      if (!file && !filename)
        throw CImgArgumentException("cimg::ftype(): Specified filename is (null).");
      static const char
        *const _pnm = "pnm",
        *const _pfm = "pfm",
        *const _bmp = "bmp",
        *const _gif = "gif",
        *const _jpg = "jpg",
        *const _off = "off",
        *const _pan = "pan",
        *const _png = "png",
        *const _tif = "tif",
        *const _inr = "inr",
        *const _dcm = "dcm";
      const char *f_type = 0;
      CImg<char> header;
      const unsigned int omode = cimg::exception_mode();
      cimg::exception_mode(0);
      try {
        header._load_raw(file,filename,512,1,1,1,false,false,0);
        const unsigned char *const uheader = (unsigned char*)header._data;
        if (!std::strncmp(header,"OFF\n",4)) f_type = _off; // OFF
        else if (!std::strncmp(header,"#INRIMAGE",9)) // INRIMAGE
          f_type = _inr;
        else if (!std::strncmp(header,"PANDORE",7)) // PANDORE
          f_type = _pan;
        else if (!std::strncmp(header.data() + 128,"DICM",4)) // DICOM
          f_type = _dcm;
        else if (uheader[0]==0xFF && uheader[1]==0xD8 && uheader[2]==0xFF) // JPEG
          f_type = _jpg;
        else if (header[0]=='B' && header[1]=='M') // BMP
          f_type = _bmp;
        else if (header[0]=='G' && header[1]=='I' && header[2]=='F' && header[3]=='8' && header[5]=='a' &&
                 (header[4]=='7' || header[4]=='9')) // GIF
          f_type = _gif;
        else if (uheader[0]==0x89 && uheader[1]==0x50 && uheader[2]==0x4E && uheader[3]==0x47 &&
                 uheader[4]==0x0D && uheader[5]==0x0A && uheader[6]==0x1A && uheader[7]==0x0A) // PNG
          f_type = _png;
        else if ((uheader[0]==0x49 && uheader[1]==0x49) || (uheader[0]==0x4D && uheader[1]==0x4D)) // TIFF
          f_type = _tif;
        else { // PNM or PFM
          CImgList<char> _header = header.get_split(CImg<char>::vector('\n'),0,false);
          cimglist_for(_header,l) {
            if (_header(l,0)=='#') continue;
            if (_header[l]._height==2 && _header(l,0)=='P') {
              const char c = _header(l,1);
              if (c=='f' || c=='F') { f_type = _pfm; break; }
              if (c>='1' && c<='9') { f_type = _pnm; break; }
            }
            f_type = 0; break;
          }
        }
      } catch (CImgIOException&) { }
      cimg::exception_mode(omode);
      return f_type;
    }